

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integrator.cpp
# Opt level: O2

void __thiscall
OpenMD::Integrator::setVelocitizer
          (Integrator *this,
          unique_ptr<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_> *velocitizer)

{
  std::__uniq_ptr_impl<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_>::operator=
            ((__uniq_ptr_impl<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_> *)
             &this->velocitizer_,
             (__uniq_ptr_impl<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_> *)
             velocitizer);
  return;
}

Assistant:

void Integrator::setVelocitizer(std::unique_ptr<Velocitizer> velocitizer) {
    velocitizer_ = std::move(velocitizer);
  }